

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_tidy(_glist *x)

{
  int iVar1;
  t_gobj *ptVar2;
  t_gobj *y;
  int iVar3;
  int iVar4;
  void *data;
  t_gobj **pptVar5;
  long lVar6;
  _gobj **pp_Var7;
  ulong uVar8;
  bool bVar9;
  int bx1;
  int by1;
  int ay1;
  int ax1;
  int ay2;
  int by2;
  t_gobj *local_e8;
  _gobj **local_e0;
  int bx2;
  int ax2;
  int local_d0 [2];
  int histogram [35];
  
  if (x->gl_editor == (t_editor *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = x->gl_editor->e_selection != (t_selection *)0x0;
  }
  data = canvas_undo_set_move(x,(uint)bVar9);
  canvas_undo_add(x,UNDO_MOTION,"{tidy up}",data);
  pptVar5 = &x->gl_list;
  local_e0 = pptVar5;
  while (ptVar2 = *pptVar5, ptVar2 != (t_gobj *)0x0) {
    local_e8 = ptVar2;
    if ((bVar9 == false) || (iVar4 = glist_isselected(x,ptVar2), iVar4 != 0)) {
      gobj_getrect(local_e8,x,&ax1,&ay1,&ax2,&ay2);
      pp_Var7 = local_e0;
      while (ptVar2 = *pp_Var7, pp_Var7 = local_e0, ptVar2 != (t_gobj *)0x0) {
        if ((((bVar9 == false) || (iVar4 = glist_isselected(x,ptVar2), iVar4 != 0)) &&
            (gobj_getrect(ptVar2,x,&bx1,&by1,&bx2,&by2), ay1 + -0x11 <= by1 && by1 <= ay1 + 0x11))
           && (bx1 < ax1)) goto LAB_0013fa60;
        pp_Var7 = &ptVar2->g_next;
      }
      while (ptVar2 = *pp_Var7, ptVar2 != (t_gobj *)0x0) {
        if ((bVar9 == false) || (iVar4 = glist_isselected(x,ptVar2), iVar4 != 0)) {
          gobj_getrect(ptVar2,x,&bx1,&by1,&bx2,&by2);
          if ((ay1 - by1 != 0) && ((by1 <= ay1 + 0x11 && (ay1 + -0x11 <= by1)))) {
            gobj_displace(ptVar2,x,0,ay1 - by1);
          }
        }
        pp_Var7 = &ptVar2->g_next;
      }
    }
LAB_0013fa60:
    pptVar5 = &local_e8->g_next;
  }
  for (lVar6 = 0; (int)lVar6 != 0x23; lVar6 = lVar6 + 1) {
    histogram[lVar6] = 0;
  }
  pp_Var7 = local_e0;
  while (ptVar2 = *pp_Var7, ptVar2 != (t_gobj *)0x0) {
    if ((bVar9 == false) || (iVar4 = glist_isselected(x,ptVar2), iVar4 != 0)) {
      gobj_getrect(ptVar2,x,&ax1,&ay1,&ax2,&ay2);
      pp_Var7 = local_e0;
      while (y = *pp_Var7, y != (t_gobj *)0x0) {
        if ((((bVar9 == false) || (iVar4 = glist_isselected(x,y), iVar4 != 0)) &&
            (gobj_getrect(y,x,&bx1,&by1,&bx2,&by2), ax1 + -0x12 <= bx1 && bx1 <= ax1 + 0x12)) &&
           ((uint)(by1 - ay2) < 0x23)) {
          histogram[(uint)(by1 - ay2)] = histogram[(uint)(by1 - ay2)] + 1;
        }
        pp_Var7 = &y->g_next;
      }
    }
    pp_Var7 = &ptVar2->g_next;
  }
  uVar8 = 4;
  iVar4 = 0;
  for (lVar6 = 4; (int)lVar6 != 0x23; lVar6 = lVar6 + 1) {
    iVar1 = local_d0[lVar6] * 3 + (&bx2)[lVar6] + histogram[lVar6] +
            (histogram[lVar6 + -1] + (&ax2)[lVar6]) * 2;
    iVar3 = iVar4;
    if (iVar4 < iVar1) {
      iVar3 = iVar1;
    }
    if (iVar4 < iVar1) {
      uVar8 = lVar6 - 2;
    }
    uVar8 = uVar8 & 0xffffffff;
    iVar4 = iVar3;
  }
  local_d0[0] = (int)uVar8;
  logpost((void *)0x0,3,"tidy: best vertical distance %d");
  pp_Var7 = local_e0;
  do {
    ptVar2 = *pp_Var7;
    if (ptVar2 == (t_gobj *)0x0) {
      canvas_dirty(x,1.0);
      return;
    }
    local_e8 = ptVar2;
    if ((bVar9 == false) || (iVar4 = glist_isselected(x,ptVar2), iVar4 != 0)) {
      gobj_getrect(local_e8,x,&ax1,&ay1,&ax2,&ay2);
      pp_Var7 = local_e0;
      while (ptVar2 = *pp_Var7, pp_Var7 = local_e0, ptVar2 != (t_gobj *)0x0) {
        if (((bVar9 == false) || (iVar4 = glist_isselected(x,ptVar2), iVar4 != 0)) &&
           ((gobj_getrect(ptVar2,x,&bx1,&by1,&bx2,&by2), ax1 + -0x12 <= bx1 && bx1 <= ax1 + 0x12 &&
            (by2 + -10 <= ay1 && ay1 < by2 + 0x23)))) goto LAB_0013fd2b;
        pp_Var7 = &ptVar2->g_next;
      }
      do {
        while( true ) {
          ptVar2 = *pp_Var7;
          if (ptVar2 == (t_gobj *)0x0) goto LAB_0013fd2b;
          if ((((bVar9 == false) || (iVar4 = glist_isselected(x,ptVar2), iVar4 != 0)) &&
              (gobj_getrect(ptVar2,x,&bx1,&by1,&bx2,&by2), ax1 + -0x12 <= bx1 && bx1 <= ax1 + 0x12))
             && ((ay1 < by1 && (by1 < ay2 + 0x23)))) break;
          pp_Var7 = &ptVar2->g_next;
        }
        local_d0[1] = (local_d0[0] - by1) + ay2;
        gobj_displace(ptVar2,x,ax1 - bx1,local_d0[1]);
        ay1 = by1 + local_d0[1];
        ay2 = local_d0[1] + by2;
        pp_Var7 = local_e0;
      } while (ptVar2 != (t_gobj *)0x0);
    }
LAB_0013fd2b:
    pp_Var7 = &local_e8->g_next;
  } while( true );
}

Assistant:

static void canvas_tidy(t_canvas *x)
{
    t_gobj *y, *y2;
    int ax1, ay1, ax2, ay2, bx1, by1, bx2, by2;
    int histogram[NHIST], *ip, i, besthist, bestdist;
        /* if nobody is selected, this means do it to all boxes;
           otherwise just the selection */
    int all = (x->gl_editor ? (x->gl_editor->e_selection == 0) : 1);

    canvas_undo_add(x, UNDO_MOTION, "{tidy up}", canvas_undo_set_move(x, !all));

        /* tidy horizontally */
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);

            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (by1 <= ay1 + YTOLERANCE && by1 >= ay1 - YTOLERANCE &&
                        bx1 < ax1)
                        goto nothorizhead;
                }

            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (by1 <= ay1 + YTOLERANCE && by1 >= ay1 - YTOLERANCE
                        && by1 != ay1)
                        gobj_displace(y2, x, 0, ay1-by1);
                }
        nothorizhead: ;
        }
        /* tidy vertically.  First guess the user's favorite vertical spacing */
    for (i = NHIST, ip = histogram; i--; ip++) *ip = 0;
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);
            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE)
                    {
                        int distance = by1-ay2;
                        if (distance >= 0 && distance < NHIST)
                            histogram[distance]++;
                    }
                }
        }
    for (i = 2, besthist = 0, bestdist = 4, ip = histogram + 2;
         i < (NHIST-2); i++, ip++)
    {
        int hit = ip[-2] + 2 * ip[-1] + 3 * ip[0] + 2* ip[1] + ip[2];
        if (hit > besthist)
        {
            besthist = hit;
            bestdist = i;
        }
    }
    logpost(NULL, 3, "tidy: best vertical distance %d", bestdist);
    for (y = x->gl_list; y; y = y->g_next)
        if (all || glist_isselected(x, y))
        {
            int keep = 1;
            gobj_getrect(y, x, &ax1, &ay1, &ax2, &ay2);
            for (y2 = x->gl_list; y2; y2 = y2->g_next)
                if (all || glist_isselected(x, y2))
                {
                    gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                    if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE &&
                        ay1 >= by2 - 10 && ay1 < by2 + NHIST)
                        goto nothead;
                }
            while (keep)
            {
                keep = 0;
                for (y2 = x->gl_list; y2; y2 = y2->g_next)
                    if (all || glist_isselected(x, y2))
                    {
                        gobj_getrect(y2, x, &bx1, &by1, &bx2, &by2);
                        if (bx1 <= ax1 + XTOLERANCE && bx1 >= ax1 - XTOLERANCE &&
                            by1 > ay1 && by1 < ay2 + NHIST)
                        {
                            int vmove = ay2 + bestdist - by1;
                            gobj_displace(y2, x, ax1-bx1, vmove);
                            ay1 = by1 + vmove;
                            ay2 = by2 + vmove;
                            keep = 1;
                            break;
                        }
                    }
            }
        nothead: ;
        }
    canvas_dirty(x, 1);
}